

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O3

NeuralNetworkClassifier *
buildBasicNeuralNetworkClassifierModel
          (Model *m,bool isUpdatable,TensorAttributes *inTensorAttr,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *stringClassLabels,vector<long,_std::allocator<long>_> *intClassLabels,bool includeBias)

{
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this;
  RepeatedField<float> *pRVar1;
  int iVar2;
  pointer pbVar3;
  pointer pcVar4;
  pointer pcVar5;
  Rep *pRVar6;
  string *psVar7;
  size_t __n;
  Model *pMVar8;
  TensorAttributes *pTVar9;
  int iVar10;
  ModelDescription *pMVar11;
  Type *pTVar12;
  FeatureType *pFVar13;
  ArrayFeatureType *this_00;
  StringFeatureType *pSVar14;
  DictionaryFeatureType *this_01;
  NeuralNetworkClassifier *pNVar15;
  StringVector *this_02;
  Int64Vector *this_03;
  Type *pTVar16;
  LayerUnion LVar17;
  WeightParams *pWVar18;
  LogMessage *pLVar19;
  SoftmaxLayerParams *this_04;
  ModelDescription *pMVar20;
  pointer pbVar21;
  uint64 uVar22;
  Rep *pRVar23;
  void **ppvVar24;
  char cVar25;
  long lVar26;
  undefined7 in_register_00000031;
  undefined7 in_register_00000089;
  int iVar27;
  float *pfVar28;
  int new_size;
  long lVar29;
  uint64 uVar30;
  bool bVar31;
  initializer_list<long> __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> className;
  LogFinisher local_151;
  Model *local_150;
  undefined1 local_148 [56];
  pointer local_110;
  pointer local_108;
  allocator_type local_f9;
  LayerUnion local_f8;
  NeuralNetworkClassifier *local_f0;
  undefined4 local_e8;
  undefined4 local_e4;
  Type *local_e0;
  RepeatedPtrFieldBase *local_d8;
  TensorAttributes *local_d0;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_c8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_98;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_60;
  
  local_108 = (stringClassLabels->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  local_110 = (stringClassLabels->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  pMVar11 = m->description_;
  local_f8 = (LayerUnion)intClassLabels;
  local_f0 = (NeuralNetworkClassifier *)stringClassLabels;
  if (pMVar11 == (ModelDescription *)0x0) {
    pMVar11 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar11);
    m->description_ = pMVar11;
  }
  local_e8 = (undefined4)CONCAT71(in_register_00000031,isUpdatable);
  local_150 = m;
  pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                      (&(pMVar11->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pFVar13 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(pFVar13);
  local_e4 = (undefined4)CONCAT71(in_register_00000089,includeBias);
  if (pFVar13->_oneof_case_[0] == 5) {
    this_00 = (pFVar13->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar13);
    pFVar13->_oneof_case_[0] = 5;
    this_00 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(this_00);
    (pFVar13->Type_).multiarraytype_ = this_00;
  }
  iVar10 = inTensorAttr->dimension;
  iVar27 = (this_00->shape_).current_size_;
  if (iVar27 == (this_00->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&this_00->shape_,iVar27 + 1);
    iVar27 = (this_00->shape_).current_size_;
  }
  (this_00->shape_).current_size_ = iVar27 + 1;
  ((this_00->shape_).rep_)->elements[iVar27] = (long)iVar10;
  this_00->datatype_ = 0x10040;
  CoreML::Specification::FeatureDescription::set_name(pTVar12,inTensorAttr->name);
  if (pTVar12->type_ != (FeatureType *)0x0) {
    (*(pTVar12->type_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pMVar8 = local_150;
  pTVar12->type_ = pFVar13;
  pMVar11 = local_150->description_;
  if (pMVar11 == (ModelDescription *)0x0) {
    pMVar11 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar11);
    pMVar8->description_ = pMVar11;
  }
  pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                      (&(pMVar11->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pFVar13 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(pFVar13);
  if (local_110 == local_108) {
    if (pFVar13->_oneof_case_[0] != 1) {
      CoreML::Specification::FeatureType::clear_Type(pFVar13);
      pFVar13->_oneof_case_[0] = 1;
      pSVar14 = (StringFeatureType *)operator_new(0x18);
      CoreML::Specification::Int64FeatureType::Int64FeatureType((Int64FeatureType *)pSVar14);
      goto LAB_001c8d52;
    }
  }
  else if (pFVar13->_oneof_case_[0] != 3) {
    CoreML::Specification::FeatureType::clear_Type(pFVar13);
    pFVar13->_oneof_case_[0] = 3;
    pSVar14 = (StringFeatureType *)operator_new(0x18);
    CoreML::Specification::StringFeatureType::StringFeatureType(pSVar14);
LAB_001c8d52:
    (pFVar13->Type_).stringtype_ = pSVar14;
  }
  pcVar5 = local_148 + 0x10;
  local_148._0_8_ = pcVar5;
  local_d0 = inTensorAttr;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"predictedClass","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar12->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_148);
  if ((pointer)local_148._0_8_ != pcVar5) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
  }
  if (pTVar12->type_ != (FeatureType *)0x0) {
    (*(pTVar12->type_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pMVar8 = local_150;
  pTVar12->type_ = pFVar13;
  pMVar11 = local_150->description_;
  if (pMVar11 == (ModelDescription *)0x0) {
    pMVar11 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar11);
    pMVar8->description_ = pMVar11;
  }
  pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                      (&(pMVar11->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pFVar13 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(pFVar13);
  if (pFVar13->_oneof_case_[0] == 6) {
    this_01 = (pFVar13->Type_).dictionarytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar13);
    pFVar13->_oneof_case_[0] = 6;
    this_01 = (DictionaryFeatureType *)operator_new(0x20);
    CoreML::Specification::DictionaryFeatureType::DictionaryFeatureType(this_01);
    (pFVar13->Type_).dictionarytype_ = this_01;
  }
  if (local_110 == local_108) {
    if (this_01->_oneof_case_[0] == 1) goto LAB_001c8eab;
    CoreML::Specification::DictionaryFeatureType::clear_KeyType(this_01);
    this_01->_oneof_case_[0] = 1;
    pSVar14 = (StringFeatureType *)operator_new(0x18);
    CoreML::Specification::Int64FeatureType::Int64FeatureType((Int64FeatureType *)pSVar14);
  }
  else {
    if (this_01->_oneof_case_[0] == 2) goto LAB_001c8eab;
    CoreML::Specification::DictionaryFeatureType::clear_KeyType(this_01);
    this_01->_oneof_case_[0] = 2;
    pSVar14 = (StringFeatureType *)operator_new(0x18);
    CoreML::Specification::StringFeatureType::StringFeatureType(pSVar14);
  }
  (this_01->KeyType_).stringkeytype_ = pSVar14;
LAB_001c8eab:
  local_148._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"classProbabilities","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar12->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_148);
  if ((pointer)local_148._0_8_ != pcVar5) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
  }
  if (pTVar12->type_ != (FeatureType *)0x0) {
    (*(pTVar12->type_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pTVar12->type_ = pFVar13;
  pMVar11 = local_150->description_;
  if (pMVar11 == (ModelDescription *)0x0) {
    pMVar11 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar11);
    local_150->description_ = pMVar11;
  }
  local_148._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"predictedClass","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pMVar11->predictedfeaturename_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_148);
  pMVar8 = local_150;
  if ((pointer)local_148._0_8_ != pcVar5) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
  }
  pMVar11 = pMVar8->description_;
  if (pMVar11 == (ModelDescription *)0x0) {
    pMVar11 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar11);
    local_150->description_ = pMVar11;
  }
  local_148._0_8_ = pcVar5;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"classProbabilities","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pMVar11->predictedprobabilitiesname_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_148);
  pMVar8 = local_150;
  if ((pointer)local_148._0_8_ != pcVar5) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
  }
  if (pMVar8->_oneof_case_[0] == 0x193) {
    pNVar15 = (pMVar8->Type_).neuralnetworkclassifier_;
  }
  else {
    CoreML::Specification::Model::clear_Type(pMVar8);
    pMVar8->_oneof_case_[0] = 0x193;
    pNVar15 = (NeuralNetworkClassifier *)operator_new(0x68);
    CoreML::Specification::NeuralNetworkClassifier::NeuralNetworkClassifier(pNVar15);
    (pMVar8->Type_).neuralnetworkclassifier_ = pNVar15;
  }
  if (local_110 == local_108) {
    pbVar3 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_f8)->_M_impl).super__Vector_impl_data._M_finish;
    for (pbVar21 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_f8)->_M_impl).super__Vector_impl_data._M_start; pbVar21 != pbVar3;
        pbVar21 = (pointer)&pbVar21->_M_string_length) {
      pcVar5 = (pbVar21->_M_dataplus)._M_p;
      if (pNVar15->_oneof_case_[0] == 0x65) {
        this_03 = (pNVar15->ClassLabels_).int64classlabels_;
      }
      else {
        CoreML::Specification::NeuralNetworkClassifier::clear_ClassLabels(pNVar15);
        pNVar15->_oneof_case_[0] = 0x65;
        this_03 = (Int64Vector *)operator_new(0x28);
        CoreML::Specification::Int64Vector::Int64Vector(this_03);
        (pNVar15->ClassLabels_).int64classlabels_ = this_03;
      }
      iVar10 = (this_03->vector_).current_size_;
      if (iVar10 == (this_03->vector_).total_size_) {
        google::protobuf::RepeatedField<long>::Reserve(&this_03->vector_,iVar10 + 1);
        iVar10 = (this_03->vector_).current_size_;
      }
      (this_03->vector_).current_size_ = iVar10 + 1;
      ((this_03->vector_).rep_)->elements[iVar10] = (long)pcVar5;
    }
  }
  else {
    pbVar21 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_f0->super_MessageLite)->_M_impl).super__Vector_impl_data._M_start;
    pbVar3 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_f0->super_MessageLite)->_M_impl).super__Vector_impl_data._M_finish;
    if (pbVar21 != pbVar3) {
      do {
        pcVar4 = (pbVar21->_M_dataplus)._M_p;
        local_148._0_8_ = pcVar5;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_148,pcVar4,pcVar4 + pbVar21->_M_string_length);
        if (pNVar15->_oneof_case_[0] == 100) {
          this_02 = (pNVar15->ClassLabels_).stringclasslabels_;
        }
        else {
          CoreML::Specification::NeuralNetworkClassifier::clear_ClassLabels(pNVar15);
          pNVar15->_oneof_case_[0] = 100;
          this_02 = (StringVector *)operator_new(0x30);
          CoreML::Specification::StringVector::StringVector(this_02);
          (pNVar15->ClassLabels_).stringclasslabels_ = this_02;
        }
        CoreML::Specification::StringVector::add_vector(this_02,(string *)local_148);
        if ((pointer)local_148._0_8_ != pcVar5) {
          operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
        }
        pbVar21 = pbVar21 + 1;
      } while (pbVar21 != pbVar3);
    }
  }
  this = &pNVar15->layers_;
  pTVar16 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      (&this->super_RepeatedPtrFieldBase,(Type *)0x0);
  local_148._0_8_ = local_148 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"inner_product","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar16->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_148);
  local_d8 = &this->super_RepeatedPtrFieldBase;
  if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
  }
  pTVar9 = local_d0;
  CoreML::Specification::NeuralNetworkLayer::add_input(pTVar16,local_d0->name);
  CoreML::Specification::NeuralNetworkLayer::add_output(pTVar16,"intermediateOutput");
  bVar31 = local_110 != local_108;
  LVar17 = (LayerUnion)local_f0;
  if (!bVar31) {
    LVar17 = local_f8;
  }
  local_108 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&((vector<long,_std::allocator<long>_> *)LVar17.convolution_)->
                    super__Vector_base<long,_std::allocator<long>_>)->_M_impl).
              super__Vector_impl_data._M_start;
  local_110 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&((vector<long,_std::allocator<long>_> *)LVar17.convolution_)->
                    super__Vector_base<long,_std::allocator<long>_>)->_M_impl).
              super__Vector_impl_data._M_finish;
  lVar29 = (long)local_110 - (long)local_108 >> bVar31 * '\x02' + 3;
  iVar10 = pTVar9->dimension;
  uVar30 = (uint64)iVar10;
  if (pTVar16->_oneof_case_[0] == 0x8c) {
    LVar17 = pTVar16->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar16);
    pTVar16->_oneof_case_[0] = 0x8c;
    LVar17.convolution_ = (ConvolutionLayerParams *)operator_new(0x38);
    CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams(LVar17.innerproduct_);
    (pTVar16->layer_).innerproduct_ = (InnerProductLayerParams *)LVar17;
  }
  (LVar17.innerproduct_)->inputchannels_ = uVar30;
  (LVar17.splitnd_)->axis_ = lVar29;
  pWVar18 = (WeightParams *)((LVar17.activation_)->NonlinearityType_).relu_;
  if (pWVar18 == (WeightParams *)0x0) {
    pWVar18 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar18);
    ((LVar17.activation_)->NonlinearityType_).relu_ = (ActivationReLU *)pWVar18;
  }
  new_size = (int)lVar29;
  iVar27 = (int)((long)new_size * uVar30);
  local_f8 = LVar17;
  if (iVar27 < 0) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_148,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x466);
    pLVar19 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_148,"CHECK failed: (new_size) >= (0): ");
    google::protobuf::internal::LogFinisher::operator=(&local_151,pLVar19);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_148);
  }
  pRVar1 = &pWVar18->floatvalue_;
  local_f0 = pNVar15;
  local_e0 = pTVar16;
  if (pRVar1->current_size_ < iVar27) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar27);
    pRVar23 = (pWVar18->floatvalue_).rep_;
    iVar2 = (pWVar18->floatvalue_).current_size_;
    if (iVar2 != iVar27) {
      memset(pRVar23->elements + iVar2,0,(long)new_size * uVar30 * 4 + (long)iVar2 * -4);
    }
  }
  else {
    pRVar23 = (pWVar18->floatvalue_).rep_;
  }
  pRVar1->current_size_ = iVar27;
  pfVar28 = pRVar23->elements;
  if (pRVar23 == (Rep *)0x0) {
    pfVar28 = (float *)0x0;
  }
  if (iVar10 != 0) {
    uVar22 = 0;
    do {
      if (local_110 != local_108) {
        lVar26 = 0;
        do {
          iVar10 = rand();
          pfVar28[lVar26] = (float)iVar10 * 4.656613e-10;
          lVar26 = lVar26 + 1;
        } while (lVar29 != lVar26);
      }
      uVar22 = uVar22 + 1;
      pfVar28 = pfVar28 + lVar29;
    } while (uVar22 != uVar30);
  }
  pMVar8 = local_150;
  cVar25 = (char)local_e4;
  if (cVar25 != '\0') {
    (local_f8.innerproduct_)->hasbias_ = true;
    pWVar18 = (local_f8.innerproduct_)->bias_;
    if (pWVar18 == (WeightParams *)0x0) {
      pWVar18 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar18);
      (local_f8.innerproduct_)->bias_ = pWVar18;
    }
    if (new_size < 0) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_148,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x466);
      pLVar19 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_148,"CHECK failed: (new_size) >= (0): ");
      google::protobuf::internal::LogFinisher::operator=(&local_151,pLVar19);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_148);
    }
    pRVar1 = &pWVar18->floatvalue_;
    if (pRVar1->current_size_ < new_size) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar1,new_size);
      pRVar23 = (pWVar18->floatvalue_).rep_;
      iVar10 = (pWVar18->floatvalue_).current_size_;
      if (iVar10 != new_size) {
        memset(pRVar23->elements + iVar10,0,(long)new_size * 4 + (long)iVar10 * -4);
      }
    }
    else {
      pRVar23 = (pWVar18->floatvalue_).rep_;
    }
    pRVar1->current_size_ = new_size;
    pfVar28 = pRVar23->elements;
    if (pRVar23 == (Rep *)0x0) {
      pfVar28 = (float *)0x0;
    }
    if (local_110 != local_108) {
      lVar26 = 0;
      do {
        iVar10 = rand();
        pfVar28[lVar26] = (float)iVar10 * 4.656613e-10;
        lVar26 = lVar26 + 1;
      } while (lVar29 != lVar26);
    }
  }
  pTVar16 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      (local_d8,(Type *)0x0);
  local_148._0_8_ = local_148 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"softmax","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar16->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_148);
  if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(pTVar16,"intermediateOutput");
  CoreML::Specification::NeuralNetworkLayer::add_output(pTVar16,"scoreVector");
  if (pTVar16->_oneof_case_[0] != 0xaf) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar16);
    pTVar16->_oneof_case_[0] = 0xaf;
    this_04 = (SoftmaxLayerParams *)operator_new(0x18);
    CoreML::Specification::SoftmaxLayerParams::SoftmaxLayerParams(this_04);
    (pTVar16->layer_).softmax_ = this_04;
  }
  LVar17 = local_f8;
  if ((char)local_e8 != '\0') {
    pMVar8->isupdatable_ = true;
    local_e0->isupdatable_ = true;
    pWVar18 = (WeightParams *)((local_f8.activation_)->NonlinearityType_).linear_;
    if (pWVar18 == (WeightParams *)0x0) {
      pWVar18 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar18);
      ((LVar17.activation_)->NonlinearityType_).linear_ = (ActivationLinear *)pWVar18;
    }
    pWVar18->isupdatable_ = true;
    if (cVar25 != '\0') {
      pWVar18 = (LVar17.innerproduct_)->bias_;
      if (pWVar18 == (WeightParams *)0x0) {
        pWVar18 = (WeightParams *)operator_new(0x50);
        CoreML::Specification::WeightParams::WeightParams(pWVar18);
        (LVar17.innerproduct_)->bias_ = pWVar18;
      }
      pWVar18->isupdatable_ = true;
    }
    pNVar15 = local_f0;
    addCategoricalCrossEntropyLoss<CoreML::Specification::NeuralNetworkClassifier>
              (pMVar8,local_f0,"cross_entropy_loss","scoreVector","target");
    addLearningRate<CoreML::Specification::NeuralNetworkClassifier>
              (pNVar15,kSgdOptimizer,0.699999988079071,0.0,1.0);
    local_148._16_8_ = (undefined8 *)0x40;
    local_148._24_8_ = 0x80;
    local_148._0_8_ = (pointer)0x10;
    local_148._8_8_ = (void *)0x20;
    __l._M_len = 4;
    __l._M_array = (iterator)local_148;
    std::set<long,_std::less<long>,_std::allocator<long>_>::set
              ((set<long,_std::less<long>,_std::allocator<long>_> *)&local_60,__l,
               (less<long> *)&local_151,&local_f9);
    addMiniBatchSize<CoreML::Specification::NeuralNetworkClassifier>
              (pNVar15,kSgdOptimizer,0x20,1,100,
               (set<long,_std::less<long>,_std::allocator<long>_> *)&local_60);
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_60);
    local_98._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_98._M_impl.super__Rb_tree_header._M_header;
    local_98._M_impl._0_8_ = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_98._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_98._M_impl.super__Rb_tree_header._M_header._M_right =
         local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    addEpochs<CoreML::Specification::NeuralNetworkClassifier>
              (pNVar15,100,1,100,(set<long,_std::less<long>,_std::allocator<long>_> *)&local_98);
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_98);
    local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_c8._M_impl.super__Rb_tree_header._M_header;
    local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_c8._M_impl._0_8_ = 0;
    local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_c8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
    addShuffleAndSeed<CoreML::Specification::NeuralNetworkClassifier>
              (pNVar15,0x7e3,0,0x7e3,(set<long,_std::less<long>,_std::allocator<long>_> *)&local_c8)
    ;
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_c8);
    pMVar11 = pMVar8->description_;
    if (pMVar11 == (ModelDescription *)0x0) {
      pMVar11 = (ModelDescription *)operator_new(0x78);
      CoreML::Specification::ModelDescription::ModelDescription(pMVar11);
      pMVar8->description_ = pMVar11;
    }
    google::protobuf::internal::RepeatedPtrFieldBase::
    Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
              (&(pMVar11->traininginput_).super_RepeatedPtrFieldBase);
    pMVar11 = pMVar8->description_;
    pMVar20 = pMVar11;
    if (pMVar11 == (ModelDescription *)0x0) {
      pMVar20 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
    }
    pRVar6 = (pMVar20->input_).super_RepeatedPtrFieldBase.rep_;
    ppvVar24 = pRVar6->elements;
    if (pRVar6 == (Rep *)0x0) {
      ppvVar24 = (void **)0x0;
    }
    lVar29 = (long)(pMVar20->input_).super_RepeatedPtrFieldBase.current_size_;
    if (lVar29 != 0) {
      lVar26 = 0;
      do {
        CoreML::Specification::FeatureDescription::FeatureDescription
                  ((FeatureDescription *)local_148,*(FeatureDescription **)((long)ppvVar24 + lVar26)
                  );
        pMVar11 = pMVar8->description_;
        if (pMVar11 == (ModelDescription *)0x0) {
          pMVar11 = (ModelDescription *)operator_new(0x78);
          CoreML::Specification::ModelDescription::ModelDescription(pMVar11);
          pMVar8->description_ = pMVar11;
        }
        pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                            (&(pMVar11->traininginput_).super_RepeatedPtrFieldBase,(Type *)0x0);
        CoreML::Specification::FeatureDescription::CopyFrom(pTVar12,(FeatureDescription *)local_148)
        ;
        CoreML::Specification::FeatureDescription::~FeatureDescription
                  ((FeatureDescription *)local_148);
        lVar26 = lVar26 + 8;
      } while (lVar29 * 8 != lVar26);
      pMVar11 = pMVar8->description_;
    }
    if (pMVar11 == (ModelDescription *)0x0) {
      pMVar11 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
    }
    pRVar6 = (pMVar11->output_).super_RepeatedPtrFieldBase.rep_;
    ppvVar24 = pRVar6->elements;
    if (pRVar6 == (Rep *)0x0) {
      ppvVar24 = (void **)0x0;
    }
    lVar29 = (long)(pMVar11->output_).super_RepeatedPtrFieldBase.current_size_;
    if (lVar29 != 0) {
      lVar26 = 0;
      do {
        CoreML::Specification::FeatureDescription::FeatureDescription
                  ((FeatureDescription *)local_148,*(FeatureDescription **)((long)ppvVar24 + lVar26)
                  );
        pMVar11 = pMVar8->description_;
        pMVar20 = pMVar11;
        if (pMVar11 == (ModelDescription *)0x0) {
          pMVar20 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
        }
        psVar7 = (pMVar20->predictedfeaturename_).ptr_;
        __n = *(size_t *)(local_148._16_8_ + 8);
        if ((__n == psVar7->_M_string_length) &&
           ((__n == 0 ||
            (iVar10 = bcmp(*(void **)local_148._16_8_,(psVar7->_M_dataplus)._M_p,__n), iVar10 == 0))
           )) {
          if (pMVar11 == (ModelDescription *)0x0) {
            pMVar11 = (ModelDescription *)operator_new(0x78);
            CoreML::Specification::ModelDescription::ModelDescription(pMVar11);
            pMVar8->description_ = pMVar11;
          }
          pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                              (&(pMVar11->traininginput_).super_RepeatedPtrFieldBase,(Type *)0x0);
          CoreML::Specification::FeatureDescription::CopyFrom
                    (pTVar12,(FeatureDescription *)local_148);
        }
        CoreML::Specification::FeatureDescription::~FeatureDescription
                  ((FeatureDescription *)local_148);
        lVar26 = lVar26 + 8;
      } while (lVar29 * 8 != lVar26);
    }
  }
  return local_f0;
}

Assistant:

Specification::NeuralNetworkClassifier* buildBasicNeuralNetworkClassifierModel(Specification::Model& m, bool isUpdatable, const TensorAttributes *inTensorAttr, std::vector<std::string> stringClassLabels, std::vector<int64_t> intClassLabels, bool includeBias) {
    
    bool usesStringClassLabels = stringClassLabels.size() > 0;
    
    auto input = m.mutable_description()->add_input();
    auto inputType = new Specification::FeatureType;
    auto multiArray = inputType->mutable_multiarraytype();
    multiArray->mutable_shape()->Add(inTensorAttr->dimension);
    multiArray->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_DOUBLE);
    input->set_name(inTensorAttr->name);
    input->set_allocated_type(inputType);
    
    auto output = m.mutable_description()->add_output();
    auto outputType = new Specification::FeatureType;
    if (usesStringClassLabels) {
        outputType->mutable_stringtype();
    } else {
        outputType->mutable_int64type();
    }
    
    output->set_name("predictedClass");
    output->set_allocated_type(outputType);
    
    output = m.mutable_description()->add_output();
    outputType = new Specification::FeatureType;
    auto dictionary = outputType->mutable_dictionarytype();
    if (usesStringClassLabels) {
        dictionary->mutable_stringkeytype();
    } else {
        dictionary->mutable_int64keytype();
    }
    
    output->set_name("classProbabilities");
    output->set_allocated_type(outputType);

    m.mutable_description()->set_predictedfeaturename("predictedClass");
    m.mutable_description()->set_predictedprobabilitiesname("classProbabilities");
    
    auto classifier = m.mutable_neuralnetworkclassifier();
    
    if (usesStringClassLabels) {
        for (auto className : stringClassLabels) {
            classifier->mutable_stringclasslabels()->add_vector(className);
        }
    } else {
        for (auto className : intClassLabels) {
            classifier->mutable_int64classlabels()->add_vector(className);
        }
    }
    
    // Add inner product layer
    auto innerProductLayer = classifier->add_layers();
    innerProductLayer->set_name("inner_product");
    innerProductLayer->add_input(inTensorAttr->name);
    innerProductLayer->add_output("intermediateOutput");
    
    uint64_t C_in = (uint64_t)inTensorAttr->dimension;
    uint64_t C_out = 0;
    
    if (usesStringClassLabels) {
        C_out = (uint64_t)stringClassLabels.size();
    } else {
        C_out = (uint64_t)intClassLabels.size();
    }
    
    auto innerProductParams = innerProductLayer->mutable_innerproduct();
    innerProductParams->set_inputchannels(C_in);
    innerProductParams->set_outputchannels(C_out);
    
    ::google::protobuf::RepeatedField<float>* weightsWrite = innerProductParams->mutable_weights()->mutable_floatvalue();
    weightsWrite->Resize((int)C_in * (int)C_out, 0.0);
    float *destination_weights = weightsWrite->mutable_data();
    for (uint64_t i = 0; i < C_in; i++) {
        for (uint64_t j = 0; j < C_out; j++) {
            float random = float(rand())/float(RAND_MAX);
            destination_weights[i * C_out + j] = random;
        }
    }
    
    if (includeBias) {
        innerProductParams->set_hasbias(true);
        
        ::google::protobuf::RepeatedField<float>* biasWrite = innerProductParams->mutable_bias()->mutable_floatvalue();
        biasWrite->Resize((int)1 * (int)C_out, 0.0);
        float *destination_bias = biasWrite->mutable_data();
        for (uint64_t i = 0; i < 1; i++) {
            for (uint64_t j = 0; j < C_out; j++) {
                float random = float(rand())/float(RAND_MAX);
                destination_bias[i * C_out + j] = random;
            }
        }
    }
    
    // Add inner product layer
    auto softmaxLayer = classifier->add_layers();
    softmaxLayer->set_name("softmax");
    softmaxLayer->add_input("intermediateOutput");
    softmaxLayer->add_output("scoreVector");
    softmaxLayer->mutable_softmax();
    
    if (isUpdatable) {
        m.set_isupdatable(true);
        innerProductLayer->set_isupdatable(true);
        innerProductParams->mutable_weights()->set_isupdatable(true);
        
        if (includeBias) {
            innerProductParams->mutable_bias()->set_isupdatable(true);
        }
        
        addCategoricalCrossEntropyLoss(m, classifier, "cross_entropy_loss", "scoreVector", "target");
        
        addLearningRate(classifier, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
        addMiniBatchSize(classifier, Specification::Optimizer::kSgdOptimizer, 32, 1, 100, {16, 32, 64, 128});
        addEpochs(classifier, 100, 1, 100, std::set<int64_t>());
        addShuffleAndSeed(classifier, 2019, 0, 2019, std::set<int64_t>());

        m.mutable_description()->clear_traininginput();
        
        for (auto feature : m.description().input()) {
            auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
            trainingInput->CopyFrom(feature);
        }
        for (auto feature : m.description().output()) {
            if (feature.name() == m.description().predictedfeaturename()) {
                auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
                trainingInput->CopyFrom(feature);
            }
        }
    }
    
    return classifier;
}